

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMWindowImp.cpp
# Opt level: O0

void __thiscall PMWindowImp::DeviceRect(PMWindowImp *this,Coord x0,Coord y0,Coord x1,Coord y1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  float *pfVar6;
  PPOINTL local_58;
  PPOINTL point [4];
  Coord top;
  Coord bottom;
  Coord right;
  Coord left;
  Coord y1_local;
  Coord x1_local;
  Coord y0_local;
  Coord x0_local;
  PMWindowImp *this_local;
  
  right = y1;
  left = x1;
  y1_local = y0;
  x1_local = x0;
  _y0_local = this;
  pfVar6 = std::min<float>(&x1_local,&left);
  fVar1 = *pfVar6;
  pfVar6 = std::max<float>(&x1_local,&left);
  fVar2 = *pfVar6;
  pfVar6 = std::min<float>(&y1_local,&right);
  fVar3 = *pfVar6;
  pfVar6 = std::max<float>(&y1_local,&right);
  local_58.y = *pfVar6;
  local_58.x = fVar1;
  point[0].x = fVar2;
  point[0].y = local_58.y;
  point[1].x = fVar2;
  point[1].y = fVar3;
  point[2].x = fVar1;
  point[2].y = fVar3;
  bVar4 = GpiBeginPath(this,this->_hps,1);
  if ((((bVar4) && (bVar4 = GpiSetCurrentPosition(this,this->_hps,point + 2), bVar4)) &&
      (iVar5 = GpiPolyLine(this,this->_hps,4,&local_58), iVar5 != 1)) &&
     (bVar4 = GpiEndPath(this,this->_hps), bVar4)) {
    GpiStrokePath(this,this->_hps,1,0);
  }
  return;
}

Assistant:

void PMWindowImp::DeviceRect (
    Coord x0, Coord y0, Coord x1, Coord y1
) {
    Coord left = min(x0, x1);
    Coord right = max(x0, x1);
    Coord bottom = min(y0, y1);
    Coord top = max(y0, y1);

    PPOINTL point[4];

    point[0].x = left;    point[0].y = top;
    point[1].x = right;   point[1].y = top;
    point[2].x = right;   point[2].y = bottom;
    point[3].x = left;    point[3].y = bottom;

    if (
        (GpiBeginPath(_hps, 1L) == false) ||
        (GpiSetCurrentPosition(_hps, &point[3]) == false) ||
        (GpiPolyLine(_hps, 4L, point) == GPI_ERROR)  ||
        (GpiEndPath(_hps) == false)
    ) {
        // report error

    } else {
        GpiStrokePath(_hps, 1L, 0L);
    }
}